

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

int __thiscall
QFusionStyle::styleHint
          (QFusionStyle *this,StyleHint hint,QStyleOption *option,QWidget *widget,
          QStyleHintReturn *returnData)

{
  QRegionData *pQVar1;
  int iVar2;
  uint uVar3;
  QStyleOptionGroupBox *pQVar4;
  QStyleOptionComboBox *pQVar5;
  QStyleHintReturnMask *pQVar6;
  QBrush *pQVar7;
  uint uVar8;
  QRegion *this_00;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QRegion local_50;
  undefined8 local_48;
  Representation local_40;
  Representation local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 1;
  switch(hint) {
  case SH_EtchDisabledText:
  case SH_MainWindow_SpaceBelowMenuBar:
  case SH_Menu_AllowActiveAndDisabled:
  case SH_ScrollView_FrameOnlyAroundContents:
  case SH_ToolBox_SelectedPageTitleBold:
  case SH_RubberBand_Mask:
switchD_00398ada_caseD_0:
    uVar3 = 0;
    break;
  case SH_DitherDisabledText:
  case SH_ScrollBar_ScrollWhenPointerLeavesControl:
  case SH_TabBar_SelectMouseType:
  case SH_TabBar_Alignment:
  case SH_Header_ArrowAlignment:
  case SH_Slider_SloppyKeyEvents:
  case SH_ProgressDialog_CenterCancelButton:
  case SH_ProgressDialog_TextLabelAlignment:
  case SH_Menu_SpaceActivatesItem:
  case SH_Widget_ShareActivation:
  case SH_Workspace_FillSpaceOnMaximize:
  case SH_BlinkCursorWhenTextSelected:
  case SH_RichText_FullWidthSelection:
  case SH_Menu_Scrollable:
  case SH_GroupBox_TextLabelColor:
  case SH_Menu_SloppySubMenus:
  case SH_LineEdit_PasswordCharacter:
  case SH_DialogButtons_DefaultButton:
  case SH_TabBar_PreferNoArrows:
  case SH_ScrollBar_LeftClickAbsolutePosition:
  case SH_ListViewExpand_SelectMouseType:
  case SH_UnderlineShortcut:
  case SH_SpinBox_AnimateButton:
  case SH_SpinBox_KeyPressAutoRepeatRate:
  case SH_SpinBox_ClickAutoRepeatRate:
  case SH_Menu_FillScreenWithScroll:
  case SH_ToolTipLabel_Opacity:
  case SH_DrawMenuBarSeparator:
  case SH_TitleBar_ModifyNotification:
  case SH_Button_FocusPolicy:
  case SH_MessageBox_UseBorderForButtonSpacing:
  case SH_ToolButton_PopupDelay:
  case SH_FocusFrame_Mask:
switchD_00398ada_caseD_1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar2 = QCommonStyle::styleHint(&this->super_QCommonStyle,hint,option,widget,returnData);
      return iVar2;
    }
    goto LAB_00398e69;
  case SH_ScrollBar_MiddleClickAbsolutePosition:
  case SH_Slider_SnapToValue:
  case SH_PrintDialog_RightAlignButtons:
  case SH_FontDialog_SelectAssociatedText:
  case SH_MenuBar_AltKeyNavigation:
  case SH_ComboBox_ListMouseTracking:
  case SH_Menu_MouseTracking:
  case SH_MenuBar_MouseTracking:
  case SH_ItemView_ChangeHighlightOnFocus:
  case SH_TitleBar_NoBorder:
  case SH_Slider_StopMouseOverSlider:
  case SH_TitleBar_AutoRaise:
    break;
  case SH_Menu_SubMenuPopupDelay:
    uVar3 = 0xe1;
    break;
  case SH_ComboBox_Popup:
    pQVar5 = qstyleoption_cast<QStyleOptionComboBox_const*>(option);
    if (pQVar5 == (QStyleOptionComboBox *)0x0) goto switchD_00398ada_caseD_0;
    uVar3 = pQVar5->editable ^ 1;
    break;
  case SH_GroupBox_TextLabelVerticalAlignment:
    pQVar4 = qstyleoption_cast<QStyleOptionGroupBox_const*>(option);
    if (pQVar4 == (QStyleOptionGroupBox *)0x0) goto switchD_00398ada_caseD_1;
    uVar8 = (pQVar4->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
            super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1e0;
    uVar3 = 0x20;
    if (uVar8 != 0) {
      uVar3 = uVar8;
    }
    break;
  case SH_Table_GridLineColor:
    if (option == (QStyleOption *)0x0) goto switchD_00398ada_caseD_0;
    pQVar7 = QPalette::window(&option->palette);
    auVar9 = QColor::darker((int)*(undefined8 *)pQVar7 + 8);
    local_48 = auVar9._0_8_;
    local_40.m_i = auVar9._8_4_;
    local_3c.m_i._0_2_ = auVar9._12_2_;
    uVar3 = QColor::rgba();
    break;
  case SH_WindowFrame_Mask:
    pQVar6 = qstyleoption_cast<QStyleHintReturnMask*>(returnData);
    if (pQVar6 == (QStyleHintReturnMask *)0x0) goto switchD_00398ada_caseD_1;
    QRegion::QRegion((QRegion *)&local_48,&option->rect,Rectangle);
    this_00 = &pQVar6->region;
    pQVar1 = (pQVar6->region).d;
    (pQVar6->region).d = local_48;
    local_48 = pQVar1;
    QRegion::~QRegion((QRegion *)&local_48);
    local_3c.m_i = (option->rect).y1.m_i;
    local_48 = *(QRegionData **)&option->rect;
    local_40.m_i = (option->rect).x1.m_i + 4;
    QRegion::QRegion(&local_50,(QRect *)&local_48,Rectangle);
    QRegion::operator-=(this_00,&local_50);
    QRegion::~QRegion(&local_50);
    local_48._0_4_ = (option->rect).x1.m_i;
    local_3c.m_i = (option->rect).y1.m_i + 1;
    local_48._4_4_ = local_3c.m_i;
    local_40.m_i = (int)local_48 + 2;
    QRegion::QRegion(&local_50,(QRect *)&local_48,Rectangle);
    QRegion::operator-=(this_00,&local_50);
    QRegion::~QRegion(&local_50);
    local_48._0_4_ = (option->rect).x1.m_i;
    local_3c.m_i = (option->rect).y1.m_i + 2;
    local_48._4_4_ = local_3c.m_i;
    local_40.m_i = (int)local_48 + 1;
    QRegion::QRegion(&local_50,(QRect *)&local_48,Rectangle);
    QRegion::operator-=(this_00,&local_50);
    QRegion::~QRegion(&local_50);
    local_40.m_i = (option->rect).x1.m_i;
    iVar2 = (option->rect).y1.m_i;
    local_48._4_4_ = iVar2 + 3;
    local_48._0_4_ = local_40.m_i;
    local_3c.m_i = iVar2 + 4;
    QRegion::QRegion(&local_50,(QRect *)&local_48,Rectangle);
    QRegion::operator-=(this_00,&local_50);
    QRegion::~QRegion(&local_50);
    local_3c.m_i = (option->rect).y1.m_i;
    local_40.m_i = (option->rect).x2.m_i;
    local_48._4_4_ = local_3c.m_i;
    local_48._0_4_ = local_40.m_i + -4;
    QRegion::QRegion(&local_50,(QRect *)&local_48,Rectangle);
    QRegion::operator-=(this_00,&local_50);
    QRegion::~QRegion(&local_50);
    local_40.m_i = (option->rect).x2.m_i;
    local_3c.m_i = (option->rect).y1.m_i + 1;
    local_48._4_4_ = local_3c.m_i;
    local_48._0_4_ = local_40.m_i + -2;
    QRegion::QRegion(&local_50,(QRect *)&local_48,Rectangle);
    QRegion::operator-=(this_00,&local_50);
    QRegion::~QRegion(&local_50);
    local_40.m_i = (option->rect).x2.m_i;
    local_3c.m_i = (option->rect).y1.m_i + 2;
    local_48._4_4_ = local_3c.m_i;
    local_48._0_4_ = local_40.m_i + -1;
    QRegion::QRegion(&local_50,(QRect *)&local_48,Rectangle);
    QRegion::operator-=(this_00,&local_50);
    QRegion::~QRegion(&local_50);
    iVar2 = (option->rect).y1.m_i;
    local_40.m_i = (option->rect).x2.m_i;
    local_48._4_4_ = iVar2 + 3;
    local_48._0_4_ = local_40.m_i;
    local_3c.m_i = iVar2 + 4;
    QRegion::QRegion(&local_50,(QRect *)&local_48,Rectangle);
    QRegion::operator-=(this_00,&local_50);
    QRegion::~QRegion(&local_50);
    break;
  default:
    switch(hint) {
    case SH_MessageBox_TextInteractionFlags:
      uVar3 = 5;
      break;
    case SH_DialogButtonBox_ButtonsHaveIcons:
    case SH_Menu_SelectionWrap:
    case SH_ItemView_MovementWithoutUpdatingSelection:
    case SH_ToolTip_Mask:
    case SH_FocusFrame_AboveWidget:
    case SH_TextControl_FocusIndicatorTextCharFormat:
      goto switchD_00398ada_caseD_1;
    case SH_MessageBox_CenterButtons:
    case SH_WizardStyle:
      goto switchD_00398ada_caseD_0;
    case SH_ItemView_ArrowKeysNavigateIntoChildren:
      break;
    default:
      if ((hint != SH_ItemView_ShowDecorationSelected) && (hint != SH_Menu_SupportsSections))
      goto switchD_00398ada_caseD_1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar3;
  }
LAB_00398e69:
  __stack_chk_fail();
}

Assistant:

int QFusionStyle::styleHint(StyleHint hint, const QStyleOption *option, const QWidget *widget,
                            QStyleHintReturn *returnData) const
{
    switch (hint) {
    case SH_Slider_SnapToValue:
    case SH_PrintDialog_RightAlignButtons:
    case SH_FontDialog_SelectAssociatedText:
    case SH_MenuBar_AltKeyNavigation:
    case SH_ComboBox_ListMouseTracking:
    case SH_Slider_StopMouseOverSlider:
    case SH_ScrollBar_MiddleClickAbsolutePosition:
    case SH_TitleBar_AutoRaise:
    case SH_TitleBar_NoBorder:
    case SH_ItemView_ShowDecorationSelected:
    case SH_ItemView_ArrowKeysNavigateIntoChildren:
    case SH_ItemView_ChangeHighlightOnFocus:
    case SH_MenuBar_MouseTracking:
    case SH_Menu_MouseTracking:
    case SH_Menu_SupportsSections:
        return 1;

#if defined(QT_PLATFORM_UIKIT)
    case SH_ComboBox_UseNativePopup:
        return 1;
#endif

    case SH_EtchDisabledText:
    case SH_ToolBox_SelectedPageTitleBold:
    case SH_ScrollView_FrameOnlyAroundContents:
    case SH_Menu_AllowActiveAndDisabled:
    case SH_MainWindow_SpaceBelowMenuBar:
    case SH_MessageBox_CenterButtons:
    case SH_RubberBand_Mask:
        return 0;

    case SH_ComboBox_Popup:
        if (const QStyleOptionComboBox *cmb = qstyleoption_cast<const QStyleOptionComboBox *>(option))
            return !cmb->editable;
        return 0;

    case SH_Table_GridLineColor:
        return option ? option->palette.window().color().darker(120).rgba() : 0;

    case SH_MessageBox_TextInteractionFlags:
        return Qt::TextSelectableByMouse | Qt::LinksAccessibleByMouse;
#if QT_CONFIG(wizard)
    case SH_WizardStyle:
        return QWizard::ClassicStyle;
#endif
    case SH_Menu_SubMenuPopupDelay:
        return 225; // default from GtkMenu

    case SH_WindowFrame_Mask:
        if (QStyleHintReturnMask *mask = qstyleoption_cast<QStyleHintReturnMask *>(returnData)) {
            //left rounded corner
            mask->region = option->rect;
            mask->region -= QRect(option->rect.left(), option->rect.top(), 5, 1);
            mask->region -= QRect(option->rect.left(), option->rect.top() + 1, 3, 1);
            mask->region -= QRect(option->rect.left(), option->rect.top() + 2, 2, 1);
            mask->region -= QRect(option->rect.left(), option->rect.top() + 3, 1, 2);

            //right rounded corner
            mask->region -= QRect(option->rect.right() - 4, option->rect.top(), 5, 1);
            mask->region -= QRect(option->rect.right() - 2, option->rect.top() + 1, 3, 1);
            mask->region -= QRect(option->rect.right() - 1, option->rect.top() + 2, 2, 1);
            mask->region -= QRect(option->rect.right() , option->rect.top() + 3, 1, 2);
            return 1;
        }
        break;
    case SH_GroupBox_TextLabelVerticalAlignment: {
        if (const auto *groupBox = qstyleoption_cast<const QStyleOptionGroupBox *>(option)) {
            if (groupBox) {
                const auto vAlign = groupBox->textAlignment & Qt::AlignVertical_Mask;
                // default fusion style is AlignTop
                return vAlign == 0 ? Qt::AlignTop : vAlign;
            }
        }
        break;
    }
    default:
        break;
    }
    return QCommonStyle::styleHint(hint, option, widget, returnData);
}